

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcLoad.c
# Opt level: O3

int Bmc_LoadAddCnf(void *pMan,int iLit)

{
  ulong *puVar1;
  long lVar2;
  ulong *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int Lits [3];
  uint local_24;
  uint local_20;
  uint local_1c;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if (*(int *)(*(long *)((long)pMan + 0x18) + 4) <= (int)((uint)iLit >> 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar5 = *(int *)(*(long *)(*(long *)((long)pMan + 0x18) + 8) + (ulong)((uint)iLit >> 1) * 4);
  lVar7 = (long)iVar5;
  if ((lVar7 < 0) || (*(int *)(*(long *)((long)pMan + 8) + 0x18) <= iVar5)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  lVar2 = *(long *)(*(long *)((long)pMan + 8) + 0x20);
  *(int *)((long)pMan + 0x20) = *(int *)((long)pMan + 0x20) + 1;
  uVar8 = *(ulong *)(lVar2 + lVar7 * 0xc);
  iVar4 = 0;
  if ((~uVar8 & 0x1fffffff1fffffff) != 0 && (~uVar8 & 0x9fffffff) != 0) {
    uVar6 = (uint)uVar8;
    if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcLoad.c"
                    ,0x4f,"int Bmc_LoadAddCnf(void *, int)");
    }
    puVar1 = (ulong *)(lVar2 + lVar7 * 0xc);
    if ((iLit & 1U) == 0) {
      if ((uVar6 >> 0x1e & 1) != 0) {
        return 0;
      }
      local_24 = iLit | 1;
      iVar5 = Bmc_LoadGetSatVar((Bmc_Load_t *)pMan,iVar5 - (uVar6 & 0x1fffffff));
      if (iVar5 < 0) {
LAB_005a1b08:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      local_20 = ((uint)*puVar1 >> 0x1d & 1) + iVar5 * 2;
      sat_solver_clause_new(*(sat_solver **)((long)pMan + 0x10),(lit *)&local_24,(lit *)&local_1c,0)
      ;
      puVar3 = *(ulong **)(*(long *)((long)pMan + 8) + 0x20);
      if ((puVar1 < puVar3) ||
         ((ulong *)((long)puVar3 + (long)*(int *)(*(long *)((long)pMan + 8) + 0x18) * 0xc) <= puVar1
         )) {
LAB_005a1ae9:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar5 = Bmc_LoadGetSatVar((Bmc_Load_t *)pMan,
                                (int)((ulong)((long)puVar1 - (long)puVar3) >> 2) * -0x55555555 -
                                (*(uint *)((long)puVar1 + 4) & 0x1fffffff));
      if (iVar5 < 0) goto LAB_005a1b08;
      local_20 = ((uint)(*puVar1 >> 0x3d) & 1) + iVar5 * 2;
      sat_solver_clause_new(*(sat_solver **)((long)pMan + 0x10),(lit *)&local_24,(lit *)&local_1c,0)
      ;
      uVar8 = 0x40000000;
    }
    else {
      if ((uVar8 >> 0x3e & 1) != 0) {
        return 0;
      }
      local_24 = iLit & 0x7ffffffe;
      iVar5 = Bmc_LoadGetSatVar((Bmc_Load_t *)pMan,iVar5 - (uVar6 & 0x1fffffff));
      if (iVar5 < 0) goto LAB_005a1b08;
      local_20 = ((uint)(*puVar1 >> 0x1d) & 1) + iVar5 * 2 ^ 1;
      puVar3 = *(ulong **)(*(long *)((long)pMan + 8) + 0x20);
      if ((puVar1 < puVar3) ||
         ((ulong *)((long)puVar3 + (long)*(int *)(*(long *)((long)pMan + 8) + 0x18) * 0xc) <= puVar1
         )) goto LAB_005a1ae9;
      iVar5 = Bmc_LoadGetSatVar((Bmc_Load_t *)pMan,
                                (int)((ulong)((long)puVar1 - (long)puVar3) >> 2) * -0x55555555 -
                                ((uint)(*puVar1 >> 0x20) & 0x1fffffff));
      if (iVar5 < 0) goto LAB_005a1b08;
      uVar8 = 0x4000000000000000;
      local_1c = ((uint)(*puVar1 >> 0x3d) & 1) + iVar5 * 2 ^ 1;
      sat_solver_clause_new
                (*(sat_solver **)((long)pMan + 0x10),(lit *)&local_24,
                 (lit *)&stack0xffffffffffffffe8,0);
    }
    *puVar1 = *puVar1 | uVar8;
    *(int *)((long)pMan + 0x24) = *(int *)((long)pMan + 0x24) + 1;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Bmc_LoadAddCnf( void * pMan, int iLit )
{
    Bmc_Load_t * p = (Bmc_Load_t *)pMan;
    int Lits[3], iVar = Abc_Lit2Var(iLit);
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, Vec_IntEntry(p->vSat2Id, iVar) );
    p->nCallBacks1++;
    if ( Gia_ObjIsCi(pObj) || Gia_ObjIsConst0(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( (Abc_LitIsCompl(iLit) ? pObj->fMark1 : pObj->fMark0) )
        return 0;
    Lits[0] = Abc_LitNot(iLit);
    if ( Abc_LitIsCompl(iLit) )
    {
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId0p(p->pGia, pObj)), !Gia_ObjFaninC0(pObj) );
        Lits[2] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId1p(p->pGia, pObj)), !Gia_ObjFaninC1(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 3, 0 );
        pObj->fMark1 = 1;
    }
    else
    {
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId0p(p->pGia, pObj)), Gia_ObjFaninC0(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 2, 0 );
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId1p(p->pGia, pObj)), Gia_ObjFaninC1(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 2, 0 );
        pObj->fMark0 = 1;
    }
    p->nCallBacks2++;
    return 1;
}